

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

void __thiscall Quest_Context::KilledPlayer(Quest_Context *this)

{
  bool bVar1;
  ushort *puVar2;
  ushort uVar3;
  allocator<char> local_99;
  key_type local_98;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if ((this->quest->quest->info).disabled == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"killedplayers",(allocator<char> *)&local_98);
    bVar1 = EOPlus::Context::QueryRule(&this->super_Context,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"killedplayers",&local_99);
      puVar2 = (ushort *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_98);
      uVar3 = *puVar2 + 1;
      *puVar2 = uVar3;
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      uVar3 = 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"killedplayers",(allocator<char> *)&local_98);
    local_38._8_8_ = 0;
    local_38._2_6_ = 0;
    local_38._0_2_ = uVar3;
    local_20 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1111:41)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1111:41)>
               ::_M_manager;
    bVar1 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_78,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"killedplayers",&local_99);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::erase(&(this->progress)._M_t,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  return;
}

Assistant:

void Quest_Context::KilledPlayer()
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("killedplayers");
	short amount = 0;

	if (check)
		amount = ++this->progress["killedplayers"];

	if (this->TriggerRule("killedplayers", [amount](const std::deque<util::variant>& args) { return amount >= int(args[0]); }))
		this->progress.erase("killedplayers");
}